

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O3

ostream * operator<<(ostream *output,sax_event_t *event)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  pointer pbVar6;
  string local_50;
  
  poVar2 = output;
  switch(event->type) {
  case invalid_type:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "invalid";
    lVar4 = 7;
    break;
  case start_document:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "start_document";
    lVar4 = 0xe;
    break;
  case finish_document:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "finish_document";
    lVar4 = 0xf;
    break;
  case comment:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"comment",7);
    std::__ostream_insert<char,std::char_traits<char>>(output,", \'",3);
    escape_string(&local_50,&event->string_data);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'}",2);
    goto LAB_0015325f;
  case table:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"table",5);
    std::__ostream_insert<char,std::char_traits<char>>(output,", {",3);
    pbVar6 = (event->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar6 != (event->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = true;
      do {
        if (!bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>(output,", ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(output,"\'",1);
        escape_string(&local_50,pbVar6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pbVar6 = pbVar6 + 1;
        bVar1 = false;
      } while (pbVar6 != (event->keys).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    goto LAB_00153163;
  case table_array_item:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"table_array_item",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(output,", {",3);
    pbVar6 = (event->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar6 != (event->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = true;
      do {
        if (!bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>(output,", ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(output,"\'",1);
        escape_string(&local_50,pbVar6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pbVar6 = pbVar6 + 1;
        bVar1 = false;
      } while (pbVar6 != (event->keys).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
LAB_00153163:
    pcVar5 = "}}";
    lVar4 = 2;
    goto LAB_001532f1;
  case key:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"key",3);
    std::__ostream_insert<char,std::char_traits<char>>(output,", \'",3);
    escape_string(&local_50,&event->string_data);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'}",2);
    goto LAB_0015325f;
  case start_array:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "start_array";
    lVar4 = 0xb;
    break;
  case finish_array:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "finish_array";
    lVar4 = 0xc;
    goto LAB_001532ba;
  case start_inline_table:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "start_inline_table";
    lVar4 = 0x12;
    break;
  case finish_inline_table:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "finish_inline_table";
    lVar4 = 0x13;
    goto LAB_001532ba;
  case boolean:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"boolean",7);
    std::__ostream_insert<char,std::char_traits<char>>(output,", ",2);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(output,0));
    goto LAB_001532e2;
  case string:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"string",6);
    std::__ostream_insert<char,std::char_traits<char>>(output,", \'",3);
    escape_string(&local_50,&event->string_data);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'}",2);
    goto LAB_0015325f;
  case datetime:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"datetime",8);
    std::__ostream_insert<char,std::char_traits<char>>(output,", \'",3);
    escape_string(&local_50,&event->string_data);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'}",2);
LAB_0015325f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return output;
    }
    operator_delete(local_50._M_dataplus._M_p);
    return output;
  case integer:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "integer";
    lVar4 = 7;
LAB_001532ba:
    std::__ostream_insert<char,std::char_traits<char>>(output,pcVar5,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(output,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)output);
LAB_001532e2:
    pcVar5 = "}";
    lVar4 = 1;
    goto LAB_001532f1;
  case floating_point:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"floating_point",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(output,", ",2);
    poVar2 = std::ostream::_M_insert<double>(event->float_data);
    goto LAB_001532e2;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/common.hpp"
                  ,0xdd,"std::ostream &operator<<(std::ostream &, const sax_event_t &)");
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,pcVar5,lVar4);
  pcVar5 = "}";
  lVar4 = 1;
LAB_001532f1:
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
  return output;
}

Assistant:

inline std::ostream &operator<<(std::ostream &output, const sax_event_t &event) {
    switch(event.type) {
    case sax_event_t::invalid_type: {
        output << "{" << "invalid" << "}";
    } break;
    case sax_event_t::start_document: {
        output << "{" << "start_document" << "}";
    } break;
    case sax_event_t::finish_document: {
        output << "{" << "finish_document" << "}";
    } break;
    case sax_event_t::comment: {
        output << "{" << "comment" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::table: {
        output << "{" << "table" << ", {";

        bool first = true;
        for (auto it = event.keys.begin(); it != event.keys.end(); ++it) {
            if (!first) {
                output << ", ";
            } else {
                first = false;
            }

            output << "'" << escape_string(*it) << "'";
        }

        output << "}}";
    } break;
    case sax_event_t::table_array_item: {
        output << "{" << "table_array_item" << ", {";

        bool first = true;
        for (auto it = event.keys.begin(); it != event.keys.end(); ++it) {
            if (!first) {
                output << ", ";
            } else {
                first = false;
            }

            output << "'" << escape_string(*it) << "'";
        }

        output << "}}";
    } break;
    case sax_event_t::key: {
        output << "{" << "key" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::start_array: {
        output << "{" << "start_array" << "}";
    } break;
    case sax_event_t::finish_array: {
        output << "{" << "finish_array" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::start_inline_table: {
        output << "{" << "start_inline_table" << "}";
    } break;
    case sax_event_t::finish_inline_table: {
        output << "{" << "finish_inline_table" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::boolean: {
        output << "{" << "boolean" << ", " << event.bool_data << "}";
    } break;
    case sax_event_t::string: {
        output << "{" << "string" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::datetime: {
        output << "{" << "datetime" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::integer: {
        output << "{" << "integer" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::floating_point: {
        output << "{" << "floating_point" << ", " << event.float_data << "}";
    } break;
    default: assert(false);
    }

    return output;
}